

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::convert_half_to_string_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstant *c,uint32_t col,
          uint32_t row)

{
  CompilerError *this_00;
  char (*pacVar1) [12];
  char (*ts_1) [13];
  char locale_radix_point;
  string *this_01;
  char (*in_R9) [2];
  float fVar2;
  spirv_cross asStack_1d8 [36];
  float local_1b4;
  string local_1b0;
  string local_190;
  undefined1 local_170 [192];
  uint *local_b0;
  size_t local_a8;
  size_t local_a0;
  uint local_98 [8];
  TypeID local_78;
  undefined8 local_60;
  __node_base_ptr *local_58;
  size_type local_50;
  __node_base local_48;
  size_type sStack_40;
  float local_38;
  size_t local_30;
  __node_base_ptr p_Stack_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  fVar2 = SPIRConstant::f16_to_f32(*(uint16_t *)((c->m).c[col].r + row));
  if (NAN(fVar2) || ABS(fVar2) == INFINITY) {
    local_170._32_8_ = local_170 + 0x38;
    local_170._8_4_ = 0;
    local_170._0_8_ = &PTR__SPIRType_003a6498;
    local_170._16_4_ = 0;
    local_170._40_8_ = 0;
    local_170._48_8_ = 8;
    local_170._88_8_ = local_170 + 0x70;
    local_170._96_8_ = 0;
    local_170._104_8_ = 8;
    local_170._120_4_ = 0;
    local_170[0x7c] = false;
    local_170[0x7d] = false;
    local_170._128_4_ = StorageClassGeneric;
    local_170._136_8_ = local_170 + 0xa0;
    local_170._144_8_ = 0;
    local_170._152_8_ = 8;
    local_b0 = local_98;
    local_a8 = 0;
    local_a0 = 8;
    local_78.id = 0;
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
    local_58 = &p_Stack_28;
    local_50 = 1;
    local_48._M_nxt = (_Hash_node_base *)0x0;
    sStack_40 = 0;
    local_38 = 1.0;
    local_30 = 0;
    p_Stack_28 = (__node_base_ptr)0x0;
    local_170._12_4_ = 0xc;
    local_170._20_4_ = 1;
    local_170._24_4_ = 1;
    if (fVar2 < INFINITY) {
      if (-INFINITY < fVar2) {
        if (!NAN(fVar2)) {
          this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
          ::std::__cxx11::string::string
                    ((string *)&local_1b0,"Cannot represent non-finite floating point constant.",
                     (allocator *)asStack_1d8);
          CompilerError::CompilerError(this_00,&local_1b0);
          __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
        }
        pacVar1 = (char (*) [12])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(asStack_1d8,this,local_170);
        join<std::__cxx11::string,char_const(&)[12]>
                  (&local_1b0,asStack_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(0.0 / 0.0)",pacVar1);
      }
      else {
        ts_1 = (char (*) [13])0x0;
        (*(this->super_Compiler)._vptr_Compiler[0x13])(asStack_1d8,this,local_170);
        join<std::__cxx11::string,char_const(&)[13]>
                  (&local_1b0,asStack_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "(-1.0 / 0.0)",ts_1);
      }
    }
    else {
      pacVar1 = (char (*) [12])0x0;
      (*(this->super_Compiler)._vptr_Compiler[0x13])(asStack_1d8,this,local_170);
      join<std::__cxx11::string,char_const(&)[12]>
                (&local_1b0,asStack_1d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(1.0 / 0.0)",
                 pacVar1);
    }
    this_01 = &local_1b0;
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)this_01);
  }
  else {
    local_170._32_8_ = local_170 + 0x38;
    local_170._8_4_ = 0;
    local_170._0_8_ = &PTR__SPIRType_003a6498;
    local_170._16_4_ = 0;
    local_170._40_8_ = 0;
    local_170._48_8_ = 8;
    local_170._88_8_ = local_170 + 0x70;
    local_170._96_8_ = 0;
    local_170._104_8_ = 8;
    local_170._120_4_ = 0;
    local_170[0x7c] = false;
    local_170[0x7d] = false;
    local_170._128_4_ = StorageClassGeneric;
    local_170._136_8_ = local_170 + 0xa0;
    local_170._144_8_ = 0;
    local_170._152_8_ = 8;
    local_b0 = local_98;
    local_a8 = 0;
    local_a0 = 8;
    local_78.id = 0;
    local_60._0_4_ = 0;
    local_60._4_4_ = 0;
    local_58 = &p_Stack_28;
    local_50 = 1;
    local_48._M_nxt = (_Hash_node_base *)0x0;
    sStack_40 = 0;
    local_38 = 1.0;
    local_30 = 0;
    p_Stack_28 = (__node_base_ptr)0x0;
    local_170._12_4_ = 0xc;
    local_170._20_4_ = 1;
    local_170._24_4_ = 1;
    local_1b4 = fVar2;
    (*(this->super_Compiler)._vptr_Compiler[0x13])(asStack_1d8,this,local_170,0);
    convert_to_string_abi_cxx11_
              (&local_190,(spirv_cross *)(ulong)(uint)(int)this->current_locale_radix_character,
               local_1b4,locale_radix_point);
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (&local_1b0,asStack_1d8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x31efa1,
               (char (*) [2])&local_190,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x30ae46,in_R9);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_1b0);
    ::std::__cxx11::string::~string((string *)&local_1b0);
    this_01 = &local_190;
  }
  ::std::__cxx11::string::~string((string *)this_01);
  ::std::__cxx11::string::~string((string *)asStack_1d8);
  SPIRType::~SPIRType((SPIRType *)local_170);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::convert_half_to_string(const SPIRConstant &c, uint32_t col, uint32_t row)
{
	string res;
	float float_value = c.scalar_f16(col, row);

	// There is no literal "hf" in GL_NV_gpu_shader5, so to avoid lots
	// of complicated workarounds, just value-cast to the half type always.
	if (std::isnan(float_value) || std::isinf(float_value))
	{
		SPIRType type;
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;

		if (float_value == numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(1.0 / 0.0)");
		else if (float_value == -numeric_limits<float>::infinity())
			res = join(type_to_glsl(type), "(-1.0 / 0.0)");
		else if (std::isnan(float_value))
			res = join(type_to_glsl(type), "(0.0 / 0.0)");
		else
			SPIRV_CROSS_THROW("Cannot represent non-finite floating point constant.");
	}
	else
	{
		SPIRType type;
		type.basetype = SPIRType::Half;
		type.vecsize = 1;
		type.columns = 1;
		res = join(type_to_glsl(type), "(", convert_to_string(float_value, current_locale_radix_character), ")");
	}

	return res;
}